

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::WriteReg(DROPlayer *this,UINT8 port,UINT8 reg,UINT8 data)

{
  DEV_DATA *pDVar1;
  byte bVar2;
  size_type sVar3;
  reference pvVar4;
  DEV_DATA *dataPtr;
  DRO_CHIPDEV *cDev;
  UINT8 devID;
  UINT8 data_local;
  UINT8 reg_local;
  UINT8 port_local;
  DROPlayer *this_local;
  
  bVar2 = (byte)((int)(uint)port >> (this->_portShift & 0x1f));
  sVar3 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::size
                    (&this->_devices);
  if (bVar2 < sVar3) {
    pvVar4 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::
             operator[](&this->_devices,(ulong)bVar2);
    pDVar1 = (pvVar4->base).defInf.dataPtr;
    if ((pDVar1 != (DEV_DATA *)0x0) && (pvVar4->write != (DEVFUNC_WRITE_A8D8)0x0)) {
      bVar2 = port & this->_portMask;
      (*pvVar4->write)(pDVar1,bVar2 << 1,reg);
      (*pvVar4->write)(pDVar1,bVar2 << 1 | 1,data);
    }
  }
  return;
}

Assistant:

void DROPlayer::WriteReg(UINT8 port, UINT8 reg, UINT8 data)
{
	UINT8 devID = port >> _portShift;
	
	if (devID >= _devices.size())
		return;
	DRO_CHIPDEV* cDev = &_devices[devID];
	DEV_DATA* dataPtr = cDev->base.defInf.dataPtr;
	if (dataPtr == NULL || cDev->write == NULL)
		return;
	
	port &= _portMask;
	cDev->write(dataPtr, (port << 1) | 0, reg);
	cDev->write(dataPtr, (port << 1) | 1, data);
	
	return;
}